

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

void opensshcert_openssh_blob(ssh_key *key,BinarySink *bs)

{
  void *pvVar1;
  strbuf *psVar2;
  BlobTransformer bt [1];
  BinarySource basesrc [1];
  BlobTransformer local_58;
  BinarySource local_48;
  
  pvVar1 = key->vt->extra;
  psVar2 = strbuf_new();
  (*key->vt->public_blob)(key,psVar2->binarysink_);
  BinarySink_put_stringsb(bs->binarysink_,psVar2);
  psVar2 = strbuf_new_nm();
  (**(code **)((key[-1].vt)->new_pub + 0x48))(key[-1].vt,psVar2->binarysink_);
  local_48.data = psVar2->u;
  local_48.len = psVar2->len;
  local_48.binarysource_ = &local_48;
  local_48.pos = 0;
  local_48.err = BSE_NO_ERROR;
  local_58.parts = (ptrlen *)0x0;
  local_58.nparts = 0;
  blobtrans_read(&local_58,local_48.binarysource_,*(blob_fmt *)((long)pvVar1 + 0x10));
  blobtrans_write(&local_58,bs,*(blob_fmt *)((long)pvVar1 + 0x20));
  blobtrans_clear(&local_58);
  strbuf_free(psVar2);
  return;
}

Assistant:

static void opensshcert_openssh_blob(ssh_key *key, BinarySink *bs)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    const opensshcert_extra *extra = key->vt->extra;

    strbuf *cert = strbuf_new();
    ssh_key_public_blob(key, BinarySink_UPCAST(cert));
    put_stringsb(bs, cert);

    strbuf *baseossh = strbuf_new_nm();
    ssh_key_openssh_blob(ck->basekey, BinarySink_UPCAST(baseossh));
    BinarySource basesrc[1];
    BinarySource_BARE_INIT_PL(basesrc, ptrlen_from_strbuf(baseossh));

    BLOBTRANS_DECLARE(bt);
    blobtrans_read(bt, basesrc, extra->base_ossh_fmt);
    blobtrans_write(bt, bs, extra->cert_ossh_fmt);
    blobtrans_clear(bt);

    strbuf_free(baseossh);
}